

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  pointer peVar1;
  const_iterator __last;
  entry_type eVar2;
  int32_t iVar3;
  mapped_type *pmVar4;
  pointer piVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> *this_00;
  int32_t j;
  int iVar7;
  iterator __begin2;
  pointer piVar8;
  long lVar9;
  int32_t i;
  ulong uVar10;
  int local_6c;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  
  words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (piVar5 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start;
      piVar5 != (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish; piVar5 = piVar5 + 1) {
    this_00 = &words;
    if (this->nwords_ <= *piVar5) {
      this_00 = &ngrams;
    }
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar5);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::operator=(idx,&words);
  piVar5 = ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      != ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    iVar7 = 0;
    for (piVar8 = ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar5; piVar8 = piVar8 + 1) {
      local_6c = *piVar8 - this->nwords_;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&local_6c);
      *pmVar4 = iVar7;
      iVar7 = iVar7 + 1;
    }
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)idx,
               (const_iterator)
               (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar8 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar8; piVar5 = piVar5 + 1) {
    *piVar5 = -1;
  }
  lVar9 = 0;
  uVar10 = 0;
  iVar7 = 0;
  while( true ) {
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)__last._M_current - (long)peVar1) / 0x48) <= uVar10) break;
    eVar2 = getType(this,(int32_t)uVar10);
    uVar6 = (ulong)iVar7;
    if ((eVar2 == label) ||
       ((uVar6 < (ulong)((long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) &&
        (uVar10 == (uint)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6])))) {
      peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      entry::operator=(peVar1 + uVar6,(entry *)((long)&(peVar1->word)._M_dataplus._M_p + lVar9));
      iVar3 = find(this,&(this->words_).
                         super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar6].word);
      (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = iVar7;
      iVar7 = iVar7 + 1;
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 0x48;
  }
  iVar7 = (int)((ulong)((long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar7;
  lVar9 = (long)iVar7 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar9;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
            (&this->words_,peVar1 + lVar9,__last);
  initNgrams(this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ngrams.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&words.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  for (auto it = idx.cbegin(); it != idx.cend(); ++it) {
    if (*it < nwords_) {words.push_back(*it);}
    else {ngrams.push_back(*it);}
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label || (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ +  nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}